

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimerQueue.h
# Opt level: O2

void __thiscall Liby::WeakTimerHolder::~WeakTimerHolder(WeakTimerHolder *this)

{
  std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
            (&(this->weakTimerPtr_).super___weak_ptr<Liby::Timer,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::_Function_base::~_Function_base(&(this->timer_).handler_.super__Function_base);
  return;
}

Assistant:

WeakTimerHolder(const TimerHolder &holder)
        : timer_(holder.getTimer().id(), holder.getTimer().timeout(), nullptr),
          weakTimerPtr_(holder.getTimerPtr()) {}